

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

void __thiscall
icu_63::UnicodeSet::UnicodeSet
          (UnicodeSet *this,uint16_t *data,int32_t dataLen,ESerialization serialization,
          UErrorCode *ec)

{
  uint uVar1;
  UBool UVar2;
  int iVar3;
  UChar32 *pUVar4;
  uint uVar5;
  ushort local_54;
  uint local_40;
  int32_t i;
  int32_t bmpLength;
  int32_t headerSize;
  UErrorCode *ec_local;
  ESerialization serialization_local;
  int32_t dataLen_local;
  uint16_t *data_local;
  UnicodeSet *this_local;
  
  UnicodeFilter::UnicodeFilter(&this->super_UnicodeFilter);
  (this->super_UnicodeFilter).super_UnicodeFunctor.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeSet_004b80e0;
  (this->super_UnicodeFilter).super_UnicodeMatcher._vptr_UnicodeMatcher =
       (_func_int **)&PTR__UnicodeSet_004b81f8;
  this->len = 1;
  this->capacity = 0x11;
  this->list = (UChar32 *)0x0;
  this->bmpSet = (BMPSet *)0x0;
  this->buffer = (UChar32 *)0x0;
  this->bufferCapacity = 0;
  this->patLen = 0;
  this->pat = (char16_t *)0x0;
  this->strings = (UVector *)0x0;
  this->stringSpan = (UnicodeSetStringSpan *)0x0;
  this->fFlags = '\0';
  UVar2 = ::U_FAILURE(*ec);
  if (UVar2 == '\0') {
    if (((serialization == kSerialized) && (data != (uint16_t *)0x0)) && (0 < dataLen)) {
      allocateStrings(this,ec);
      UVar2 = ::U_FAILURE(*ec);
      if (UVar2 == '\0') {
        iVar3 = 1;
        if ((*data & 0x8000) != 0) {
          iVar3 = 2;
        }
        if (iVar3 == 1) {
          local_54 = *data;
        }
        else {
          local_54 = data[1];
        }
        uVar5 = (uint)local_54;
        this->len = (int)((*data & 0x7fff) - uVar5) / 2 + uVar5;
        this->capacity = this->len + 1;
        pUVar4 = (UChar32 *)uprv_malloc_63((long)this->capacity << 2);
        this->list = pUVar4;
        if ((this->list == (UChar32 *)0x0) || (UVar2 = ::U_FAILURE(*ec), UVar2 != '\0')) {
          setToBogus(this);
        }
        else {
          for (local_40 = 0; uVar1 = uVar5, (int)local_40 < (int)uVar5; local_40 = local_40 + 1) {
            this->list[(int)local_40] = (uint)data[(int)(local_40 + iVar3)];
          }
          while (local_40 = uVar1, (int)local_40 < this->len) {
            this->list[(int)local_40] =
                 (uint)data[(int)((iVar3 - uVar5) + local_40 * 2)] * 0x10000 +
                 (uint)data[(int)((iVar3 - uVar5) + local_40 * 2 + 1)];
            uVar1 = local_40 + 1;
          }
          iVar3 = this->len;
          this->len = iVar3 + 1;
          this->list[iVar3] = 0x110000;
        }
      }
      else {
        setToBogus(this);
      }
    }
    else {
      *ec = U_ILLEGAL_ARGUMENT_ERROR;
      setToBogus(this);
    }
  }
  else {
    setToBogus(this);
  }
  return;
}

Assistant:

UnicodeSet::UnicodeSet(const uint16_t data[], int32_t dataLen, ESerialization serialization, UErrorCode &ec)
  : len(1), capacity(1+START_EXTRA), list(0), bmpSet(0), buffer(0),
    bufferCapacity(0), patLen(0), pat(NULL), strings(NULL), stringSpan(NULL),
    fFlags(0) {

  if(U_FAILURE(ec)) {
    setToBogus();
    return;
  }

  if( (serialization != kSerialized)
      || (data==NULL)
      || (dataLen < 1)) {
    ec = U_ILLEGAL_ARGUMENT_ERROR;
    setToBogus();
    return;
  }

  allocateStrings(ec);
  if (U_FAILURE(ec)) {
    setToBogus();
    return;
  }

  // bmp?
  int32_t headerSize = ((data[0]&0x8000)) ?2:1;
  int32_t bmpLength = (headerSize==1)?data[0]:data[1];

  len = (((data[0]&0x7FFF)-bmpLength)/2)+bmpLength;
#ifdef DEBUG_SERIALIZE
  printf("dataLen %d headerSize %d bmpLen %d len %d. data[0]=%X/%X/%X/%X\n", dataLen,headerSize,bmpLength,len, data[0],data[1],data[2],data[3]);
#endif
  capacity = len+1;
  list = (UChar32*) uprv_malloc(sizeof(UChar32) * capacity);
  if(!list || U_FAILURE(ec)) {
    setToBogus();
    return;
  }
  // copy bmp
  int32_t i;
  for(i = 0; i< bmpLength;i++) {
    list[i] = data[i+headerSize];
#ifdef DEBUG_SERIALIZE
    printf("<<16@%d[%d] %X\n", i+headerSize, i, list[i]);
#endif
  }
  // copy smp
  for(i=bmpLength;i<len;i++) {
    list[i] = ((UChar32)data[headerSize+bmpLength+(i-bmpLength)*2+0] << 16) +
              ((UChar32)data[headerSize+bmpLength+(i-bmpLength)*2+1]);
#ifdef DEBUG_SERIALIZE
    printf("<<32@%d+[%d] %lX\n", headerSize+bmpLength+i, i, list[i]);
#endif
  }
  // terminator
  list[len++]=UNICODESET_HIGH;
}